

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
vertices_of_simplex(index_t simplex_index,index_t dim,index_t n,binomial_coeff_table *binomial_coeff
                   )

{
  back_insert_iterator<std::vector<int,_std::allocator<int>_>_> out;
  undefined4 in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> *vertices;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  binomial_coeff_table *in_stack_ffffffffffffff80;
  vector<int,_std::allocator<int>_> *pvVar1;
  undefined4 in_stack_ffffffffffffff98;
  
  pvVar1 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x149727);
  std::back_inserter<std::vector<int,std::allocator<int>>>(in_stack_ffffffffffffff78);
  out.container._4_4_ = in_ESI;
  out.container._0_4_ = in_stack_ffffffffffffff98;
  get_simplex_vertices<std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
            ((index_t)((ulong)pvVar1 >> 0x20),(index_t)pvVar1,(index_t)((ulong)in_RDI >> 0x20),
             in_stack_ffffffffffffff80,out);
  return in_RDI;
}

Assistant:

std::vector<index_t> vertices_of_simplex(const index_t simplex_index, const index_t dim, const index_t n,
                                         const binomial_coeff_table& binomial_coeff) {
	std::vector<index_t> vertices;
	get_simplex_vertices(simplex_index, dim, n, binomial_coeff, std::back_inserter(vertices));
	return vertices;
}